

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O0

void __thiscall duckdb::BinarySerializer::VarIntEncode<int>(BinarySerializer *this,int value)

{
  BinarySerializer *this_00;
  const_data_ptr_t in_RDI;
  type write_size;
  uint8_t buffer [16];
  data_ptr_t in_stack_ffffffffffffffd0;
  undefined1 local_28 [40];
  
  memset(local_28,0,0x10);
  this_00 = (BinarySerializer *)
            EncodingUtil::EncodeLEB128<int>(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  WriteData(this_00,in_RDI,0x3730ad);
  return;
}

Assistant:

void VarIntEncode(T value) {
		uint8_t buffer[16] = {};
		auto write_size = EncodingUtil::EncodeLEB128<T>(buffer, value);
		D_ASSERT(write_size <= sizeof(buffer));
		WriteData(buffer, write_size);
	}